

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void scale_patch_(double *alpha,Integer *ndim,double *patch1,Integer *LO1,Integer *HI1,
                 Integer *DIMS1)

{
  ulong uVar1;
  uint ndim_00;
  ulong uVar2;
  int dims1 [7];
  int lo1 [7];
  int hi1 [7];
  int local_68 [8];
  int local_48 [8];
  int local_28 [10];
  
  ndim_00 = (uint)*ndim;
  if ((int)ndim_00 < 8) {
    if (0 < (int)ndim_00) {
      uVar1 = (ulong)(ndim_00 & 0x7fffffff);
      uVar2 = 0;
      do {
        local_28[uVar2] = (int)HI1[uVar2] + -1;
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
      uVar2 = 0;
      do {
        local_48[uVar2] = (int)LO1[uVar2] + -1;
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
      uVar2 = 0;
      do {
        local_68[uVar2] = (int)DIMS1[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    scale_patch_internal(*alpha,ndim_00,patch1,local_48,local_28,local_68);
    return;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x155,
                "void scale_patch_(double *, Integer *, double *, Integer *, Integer *, Integer *)")
  ;
}

Assistant:

void FATR scale_patch_(double *alpha, Integer *ndim, double *patch1, 
                 Integer LO1[], Integer HI1[], Integer DIMS1[])
{
int hi1[GA_MAX_DIM], lo1[GA_MAX_DIM], dims1[GA_MAX_DIM];

    assert((int)*ndim <= GA_MAX_DIM);
    f2c_adj_indices(HI1, hi1, (int)*ndim);
    f2c_adj_indices(LO1, lo1, (int)*ndim);
    f2c_copy_indices(DIMS1, dims1, (int)*ndim);
    scale_patch_internal(*alpha, (int)*ndim, patch1, lo1, hi1, dims1);
}